

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

void __thiscall Assimp::IFC::TempMesh::FixupFaceOrientation(TempMesh *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  iterator __position;
  ulong *puVar3;
  ulong *puVar4;
  pointer paVar5;
  unsigned_long uVar6;
  aiVector3t<double> *paVar7;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong *puVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  ulong *puVar11;
  pointer puVar12;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var13;
  ulong uVar14;
  aiVector3t<double> *paVar15;
  pointer puVar16;
  ulong *puVar17;
  pointer puVar18;
  aiVector3t<double> *paVar19;
  unsigned_long uVar20;
  pointer paVar21;
  ulong uVar22;
  long lVar23;
  TempMesh *pTVar24;
  TempMesh *pTVar25;
  ulong uVar26;
  ulong *puVar27;
  size_type __n;
  unsigned_long *puVar28;
  unsigned_long *puVar29;
  int iVar30;
  ulong uVar31;
  pointer paVar32;
  ulong uVar33;
  unsigned_long uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  vector<unsigned_long,_std::allocator<unsigned_long>_> todo;
  size_t farthestIndex;
  size_t nbi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> faceStartIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbour;
  IfcVector3 vavg;
  IfcVector3 farthestNormal;
  map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  facesByVertex;
  unsigned_long *local_148;
  iterator iStack_140;
  unsigned_long *local_138;
  unsigned_long local_130;
  vector<bool,_std::allocator<bool>_> local_128;
  TempMesh *local_100;
  ulong local_f8;
  ulong local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  allocator_type local_b8;
  undefined7 uStack_b7;
  double dStack_b0;
  double local_a8;
  IfcVector3 local_98;
  ulong local_80;
  IfcVector3 local_78;
  _Rb_tree<aiVector3t<double>,_std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_60;
  
  Center(&local_98,this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e8,
             (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_60);
  puVar12 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar18 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (puVar18 != puVar12) {
    uVar20 = 0;
    uVar26 = 0;
    do {
      local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar26] = uVar20;
      puVar12 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar18 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar20 = uVar20 + puVar12[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)puVar18 - (long)puVar12 >> 2));
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar18 != puVar12) {
    do {
      if (puVar12[(long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] != 0) {
        lVar23 = 0;
        uVar26 = 0;
        do {
          this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                    std::
                    map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)&local_60,
                                 (key_type *)
                                 ((long)&(this->mVerts).
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [local_e8.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(long)local_128.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p]].x + lVar23));
          __position._M_current = *(unsigned_long **)(this_00 + 8);
          if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(this_00,__position,(unsigned_long *)&local_128);
          }
          else {
            *__position._M_current =
                 (unsigned_long)
                 local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
          uVar26 = uVar26 + 1;
          puVar12 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar23 = lVar23 + 0x18;
        } while (uVar26 < puVar12[(long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p]);
        puVar18 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
    } while (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p <
             (_Bit_type *)((long)puVar18 - (long)puVar12 >> 2));
  }
  local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d0,
             ((long)(this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict3 *)&local_128,&local_b8);
  puVar8 = (ulong *)operator_new(0x50);
  puVar8[8] = 0;
  puVar8[9] = 0;
  puVar8[6] = 0;
  puVar8[7] = 0;
  puVar8[4] = 0;
  puVar8[5] = 0;
  puVar8[2] = 0;
  puVar8[3] = 0;
  *puVar8 = 0;
  puVar8[1] = 0;
  puVar12 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar18 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_100 = this;
  if (puVar18 == puVar12) {
    __n = 0;
  }
  else {
    uVar26 = 0;
    do {
      uVar31 = (ulong)puVar12[uVar26];
      if (puVar12[uVar26] != 0) {
        uVar33 = 0;
        do {
          uVar20 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar26];
          lVar23 = uVar20 + uVar33;
          pmVar9 = std::
                   map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                 *)&local_60,
                                (this->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar23);
          uVar33 = uVar33 + 1;
          pmVar10 = std::
                    map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator[]((map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                  *)&local_60,
                                 (this->mVerts).
                                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                 uVar20 + (uVar33 & 0xffffffff) % uVar31);
          puVar17 = (pmVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar3 = (pmVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar11 = puVar8;
          if (puVar17 != puVar3) {
            puVar27 = (pmVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar4 = (pmVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            do {
              if (puVar27 == puVar4) break;
              uVar31 = *puVar17;
              if (uVar31 < *puVar27) {
                puVar17 = puVar17 + 1;
              }
              else if (*puVar27 < uVar31) {
                puVar27 = puVar27 + 1;
              }
              else {
                *puVar11 = uVar31;
                puVar17 = puVar17 + 1;
                puVar27 = puVar27 + 1;
                puVar11 = puVar11 + 1;
              }
            } while (puVar17 != puVar3);
          }
          if ((long)puVar11 - (long)puVar8 == 0x10) {
            local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar23] = puVar8[*puVar8 == uVar26];
          }
          puVar12 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar31 = (ulong)puVar12[uVar26];
        } while (uVar33 < uVar31);
        puVar18 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar26 = uVar26 + 1;
      __n = (long)puVar18 - (long)puVar12 >> 2;
    } while (uVar26 < __n);
  }
  local_b8 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_128,__n,(bool *)&local_b8,(allocator_type *)&local_78);
  pTVar25 = local_100;
  if (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p !=
      local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    do {
      lVar23 = 0;
      uVar26 = 0;
      puVar17 = local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      do {
        lVar23 = (lVar23 + 1) - (ulong)((*puVar17 >> (uVar26 & 0x3f) & 1) != 0);
        iVar30 = (int)uVar26;
        puVar17 = puVar17 + (iVar30 == 0x3f);
        uVar26 = (ulong)(iVar30 + 1);
        if (iVar30 == 0x3f) {
          uVar26 = 0;
        }
      } while ((puVar17 !=
                local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
              ((uint)uVar26 !=
               local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset));
      if (lVar23 == 0) break;
      local_130 = 0xffffffffffffffff;
      paVar5 = (pTVar25->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar12 = (pTVar25->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar23 = (long)(pTVar25->mVertcnt).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar12;
      if (lVar23 == 0) {
        uVar26 = 0xffffffffffffffff;
      }
      else {
        lVar23 = lVar23 >> 2;
        uVar26 = 0xffffffffffffffff;
        dVar37 = -1.0;
        uVar31 = 0;
        do {
          uVar33 = uVar31 + 0x3f;
          if (-1 < (long)uVar31) {
            uVar33 = uVar31;
          }
          if ((local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar33 >> 6) +
                ((ulong)((uVar31 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar31 & 0x3f) & 1) == 0) {
            uVar2 = puVar12[uVar31];
            if ((ulong)uVar2 == 0) {
              dVar38 = 0.0;
              dVar39 = 0.0;
              dVar40 = 0.0;
            }
            else {
              paVar32 = paVar5 + local_e8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar31];
              paVar21 = paVar32 + uVar2;
              dVar38 = 0.0;
              dVar39 = 0.0;
              dVar40 = 0.0;
              do {
                dVar40 = dVar40 + paVar32->x;
                dVar38 = dVar38 + paVar32->y;
                dVar39 = dVar39 + paVar32->z;
                paVar32 = paVar32 + 1;
              } while (paVar32 != paVar21);
            }
            dVar42 = 1.0 / (double)uVar2;
            dVar40 = dVar40 * dVar42 - local_98.x;
            dVar41 = dVar42 * dVar38 - local_98.y;
            dVar38 = dVar39 * dVar42 - local_98.z;
            dVar38 = dVar38 * dVar38 + dVar40 * dVar40 + dVar41 * dVar41;
            if (dVar37 < dVar38) {
              uVar26 = uVar31;
              dVar37 = dVar38;
              local_130 = uVar31;
            }
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != lVar23 + (ulong)(lVar23 == 0));
      }
      ComputePolygonNormal
                (&local_78,
                 paVar5 + local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar26],(ulong)puVar12[uVar26],
                 true);
      paVar32 = (pTVar25->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start;
      uVar20 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[local_130];
      paVar5 = paVar32 + uVar20;
      uVar2 = (pTVar25->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[local_130];
      uVar26 = (ulong)uVar2;
      dVar38 = 0.0;
      dVar39 = 0.0;
      dVar37 = 0.0;
      paVar21 = paVar5;
      if (uVar26 != 0) {
        do {
          dVar37 = dVar37 + paVar21->x;
          dVar38 = dVar38 + paVar21->y;
          dVar39 = dVar39 + paVar21->z;
          paVar21 = paVar21 + 1;
        } while (paVar21 != paVar5 + uVar26);
      }
      dVar41 = 1.0 / (double)uVar26;
      dVar37 = dVar37 * dVar41 - local_98.x;
      dVar40 = dVar41 * dVar38 - local_98.y;
      dVar38 = dVar39 * dVar41 - local_98.z;
      dVar39 = 1.0 / SQRT(dVar38 * dVar38 + dVar37 * dVar37 + dVar40 * dVar40);
      if (dVar39 * dVar38 * local_78.z + dVar37 * dVar39 * local_78.x + dVar40 * dVar39 * local_78.y
          < -0.4) {
        if ((uVar26 != 0) && (paVar21 = paVar5 + uVar26 + -1, paVar5 < paVar21)) {
          paVar5 = paVar32 + uVar20;
          do {
            paVar32 = paVar5 + 1;
            local_a8 = paVar5->z;
            dVar37 = paVar5->x;
            dStack_b0 = paVar5->y;
            local_b8 = SUB81(dVar37,0);
            uStack_b7 = (undefined7)((ulong)dVar37 >> 8);
            paVar5->z = paVar21->z;
            dVar38 = paVar21->y;
            paVar5->x = paVar21->x;
            paVar5->y = dVar38;
            paVar21->z = local_a8;
            paVar21->x = dVar37;
            paVar21->y = dStack_b0;
            paVar21 = paVar21 + -1;
            paVar5 = paVar32;
          } while (paVar32 < paVar21);
        }
        if ((uVar2 != 0) &&
           (puVar16 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20 + (uVar26 - 1),
           local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + uVar20 < puVar16)) {
          puVar29 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar20;
          do {
            puVar28 = puVar29 + 1;
            uVar34 = *puVar29;
            *puVar29 = *puVar16;
            *puVar16 = uVar34;
            puVar16 = puVar16 + -1;
            puVar29 = puVar28;
          } while (puVar28 < puVar16);
        }
        while (uVar26 = uVar26 - 1, uVar26 != 0) {
          auVar1 = *(undefined1 (*) [16])
                    (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar20);
          auVar35._0_8_ = auVar1._8_8_;
          auVar35._8_4_ = auVar1._0_4_;
          auVar35._12_4_ = auVar1._4_4_;
          *(undefined1 (*) [16])
           (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + uVar20) = auVar35;
          uVar20 = uVar20 + 1;
        }
      }
      uVar26 = local_130 + 0x3f;
      if (-1 < (long)local_130) {
        uVar26 = local_130;
      }
      uVar31 = 0x800000000000003f;
      local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p
      [((long)uVar26 >> 6) + ((ulong)((local_130 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar26 >> 6) +
            ((ulong)((local_130 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)local_130 & 0x3f);
      local_148 = (unsigned_long *)0x0;
      iStack_140._M_current = (unsigned_long *)0x0;
      local_138 = (unsigned_long *)0x0;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,(iterator)0x0,
                 &local_130);
      local_80 = 0x800000000000003f;
      puVar29 = local_148;
      if (local_148 != iStack_140._M_current) {
        do {
          puVar28 = iStack_140._M_current + -1;
          iStack_140._M_current = iStack_140._M_current + -1;
          uVar20 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[*puVar28];
          uVar26 = (ulong)(pTVar25->mVertcnt).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar28];
          if (uVar26 != 0) {
            uVar33 = 0;
            pTVar24 = pTVar25;
            local_f8 = uVar26;
            do {
              local_f0 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar33 + uVar20];
              pTVar25 = pTVar24;
              if (local_f0 != 0xffffffffffffffff) {
                uVar14 = local_f0 + 0x3f;
                if (-1 < (long)local_f0) {
                  uVar14 = local_f0;
                }
                if ((local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar14 >> 6) + ((ulong)((local_f0 & uVar31) < 0x8000000000000001) - 1)]
                     >> (local_f0 & 0x3f) & 1) == 0) {
                  uVar34 = local_e8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[local_f0];
                  uVar26 = (ulong)(pTVar24->mVertcnt).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_f0];
                  paVar5 = (pTVar24->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar34;
                  _Var13 = std::
                           __find_if<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_pred<Assimp::IFC::FindVector>>
                                     (paVar5,paVar5 + uVar26);
                  uVar31 = local_80;
                  pTVar25 = local_100;
                  paVar5 = (pTVar24->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar7 = paVar5 + uVar34;
                  if (_Var13._M_current == paVar7 + uVar26) {
                    __assert_fail("it != mVerts.begin() + nbvsi + nbvc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCUtil.cpp"
                                  ,0x162,"void Assimp::IFC::TempMesh::FixupFaceOrientation()");
                  }
                  uVar22 = (((long)_Var13._M_current - (long)paVar7 >> 3) * -0x5555555555555555 + 1U
                           ) % uVar26;
                  uVar14 = uVar33 + 1;
                  if (uVar14 == local_f8) {
                    uVar14 = 0;
                  }
                  dVar37 = paVar5[uVar20 + uVar14].x - paVar7[uVar22].x;
                  dVar38 = paVar5[uVar20 + uVar14].y - paVar7[uVar22].y;
                  dVar39 = paVar5[uVar20 + uVar14].z - paVar7[uVar22].z;
                  if (ABS(dVar39 * dVar39 + dVar37 * dVar37 + dVar38 * dVar38) < 1e-06) {
                    paVar19 = paVar7 + uVar26 + -1;
                    if (paVar7 < paVar19) {
                      paVar7 = paVar5 + uVar34;
                      do {
                        paVar15 = paVar7 + 1;
                        local_a8 = paVar7->z;
                        dStack_b0 = paVar7->y;
                        dVar38 = paVar7->x;
                        dVar39 = paVar7->y;
                        local_b8 = SUB81(paVar7->x,0);
                        uStack_b7 = (undefined7)((ulong)paVar7->x >> 8);
                        paVar7->z = paVar19->z;
                        dVar37 = paVar19->y;
                        paVar7->x = paVar19->x;
                        paVar7->y = dVar37;
                        paVar19->z = local_a8;
                        paVar19->x = dVar38;
                        paVar19->y = dVar39;
                        paVar19 = paVar19 + -1;
                        paVar7 = paVar15;
                      } while (paVar15 < paVar19);
                    }
                    puVar16 = local_d0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar34 + (uVar26 - 1);
                    if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar34 < puVar16) {
                      puVar29 = local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar34;
                      do {
                        puVar28 = puVar29 + 1;
                        uVar6 = *puVar29;
                        *puVar29 = *puVar16;
                        *puVar16 = uVar6;
                        puVar16 = puVar16 + -1;
                        puVar29 = puVar28;
                      } while (puVar28 < puVar16);
                    }
                    while (uVar26 = uVar26 - 1, uVar26 != 0) {
                      auVar1 = *(undefined1 (*) [16])
                                (local_d0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar34);
                      auVar36._0_8_ = auVar1._8_8_;
                      auVar36._8_4_ = auVar1._0_4_;
                      auVar36._12_4_ = auVar1._4_4_;
                      *(undefined1 (*) [16])
                       (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar34) = auVar36;
                      uVar34 = uVar34 + 1;
                    }
                  }
                  uVar26 = local_f0 + 0x3f;
                  if (-1 < (long)local_f0) {
                    uVar26 = local_f0;
                  }
                  local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [((long)uVar26 >> 6) + ((ulong)((local_f0 & local_80) < 0x8000000000000001) - 1)]
                       = local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar26 >> 6) +
                          ((ulong)((local_f0 & local_80) < 0x8000000000000001) - 1)] |
                         1L << ((byte)local_f0 & 0x3f);
                  if (iStack_140._M_current == local_138) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,
                               iStack_140,&local_f0);
                    uVar26 = local_f8;
                  }
                  else {
                    *iStack_140._M_current = local_f0;
                    iStack_140._M_current = iStack_140._M_current + 1;
                    uVar26 = local_f8;
                  }
                }
              }
              uVar33 = uVar33 + 1;
              pTVar24 = pTVar25;
              puVar29 = local_148;
            } while (uVar33 != uVar26);
          }
        } while (puVar29 != iStack_140._M_current);
      }
      if (puVar29 != (unsigned_long *)0x0) {
        operator_delete(puVar29,(long)local_138 - (long)puVar29);
      }
    } while (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0 ||
             local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p !=
             local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
  }
  if (local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
  }
  operator_delete(puVar8,0x50);
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<aiVector3t<double>,_std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TempMesh::FixupFaceOrientation()
{
    const IfcVector3 vavg = Center();

    // create a list of start indices for all faces to allow random access to faces
    std::vector<size_t> faceStartIndices(mVertcnt.size());
    for( size_t i = 0, a = 0; a < mVertcnt.size(); i += mVertcnt[a], ++a )
        faceStartIndices[a] = i;

    // list all faces on a vertex
    std::map<IfcVector3, std::vector<size_t>, CompareVector> facesByVertex;
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
            facesByVertex[mVerts[faceStartIndices[a] + b]].push_back(a);
    }
    // determine neighbourhood for all polys
    std::vector<size_t> neighbour(mVerts.size(), SIZE_MAX);
    std::vector<size_t> tempIntersect(10);
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
        {
            size_t ib = faceStartIndices[a] + b, nib = faceStartIndices[a] + (b + 1) % mVertcnt[a];
            const std::vector<size_t>& facesOnB = facesByVertex[mVerts[ib]];
            const std::vector<size_t>& facesOnNB = facesByVertex[mVerts[nib]];
            // there should be exactly one or two faces which appear in both lists. Our face and the other side
            std::vector<size_t>::iterator sectstart = tempIntersect.begin();
            std::vector<size_t>::iterator sectend = std::set_intersection(
                facesOnB.begin(), facesOnB.end(), facesOnNB.begin(), facesOnNB.end(), sectstart);

            if( std::distance(sectstart, sectend) != 2 )
                continue;
            if( *sectstart == a )
                ++sectstart;
            neighbour[ib] = *sectstart;
        }
    }

    // now we're getting started. We take the face which is the farthest away from the center. This face is most probably
    // facing outwards. So we reverse this face to point outwards in relation to the center. Then we adapt neighbouring
    // faces to have the same winding until all faces have been tested.
    std::vector<bool> faceDone(mVertcnt.size(), false);
    while( std::count(faceDone.begin(), faceDone.end(), false) != 0 )
    {
        // find the farthest of the remaining faces
        size_t farthestIndex = SIZE_MAX;
        IfcFloat farthestDistance = -1.0;
        for( size_t a = 0; a < mVertcnt.size(); ++a )
        {
            if( faceDone[a] )
                continue;
            IfcVector3 faceCenter = std::accumulate(mVerts.begin() + faceStartIndices[a],
                mVerts.begin() + faceStartIndices[a] + mVertcnt[a], IfcVector3(0.0)) / IfcFloat(mVertcnt[a]);
            IfcFloat dst = (faceCenter - vavg).SquareLength();
            if( dst > farthestDistance ) { farthestDistance = dst; farthestIndex = a; }
        }

        // calculate its normal and reverse the poly if its facing towards the mesh center
        IfcVector3 farthestNormal = ComputePolygonNormal(mVerts.data() + faceStartIndices[farthestIndex], mVertcnt[farthestIndex]);
        IfcVector3 farthestCenter = std::accumulate(mVerts.begin() + faceStartIndices[farthestIndex],
            mVerts.begin() + faceStartIndices[farthestIndex] + mVertcnt[farthestIndex], IfcVector3(0.0))
            / IfcFloat(mVertcnt[farthestIndex]);
        // We accept a bit of negative orientation without reversing. In case of doubt, prefer the orientation given in
        // the file.
        if( (farthestNormal * (farthestCenter - vavg).Normalize()) < -0.4 )
        {
            size_t fsi = faceStartIndices[farthestIndex], fvc = mVertcnt[farthestIndex];
            std::reverse(mVerts.begin() + fsi, mVerts.begin() + fsi + fvc);
            std::reverse(neighbour.begin() + fsi, neighbour.begin() + fsi + fvc);
            // because of the neighbour index belonging to the edge starting with the point at the same index, we need to
            // cycle the neighbours through to match the edges again.
            // Before: points A - B - C - D with edge neighbour p - q - r - s
            // After: points D - C - B - A, reversed neighbours are s - r - q - p, but the should be
            //                r   q   p   s
            for( size_t a = 0; a < fvc - 1; ++a )
                std::swap(neighbour[fsi + a], neighbour[fsi + a + 1]);
        }
        faceDone[farthestIndex] = true;
        std::vector<size_t> todo;
        todo.push_back(farthestIndex);

        // go over its neighbour faces recursively and adapt their winding order to match the farthest face
        while( !todo.empty() )
        {
            size_t tdf = todo.back();
            size_t vsi = faceStartIndices[tdf], vc = mVertcnt[tdf];
            todo.pop_back();

            // check its neighbours
            for( size_t a = 0; a < vc; ++a )
            {
                // ignore neighbours if we already checked them
                size_t nbi = neighbour[vsi + a];
                if( nbi == SIZE_MAX || faceDone[nbi] )
                    continue;

                const IfcVector3& vp = mVerts[vsi + a];
                size_t nbvsi = faceStartIndices[nbi], nbvc = mVertcnt[nbi];
                std::vector<IfcVector3>::iterator it = std::find_if(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc, FindVector(vp));
                ai_assert(it != mVerts.begin() + nbvsi + nbvc);
                size_t nb_vidx = std::distance(mVerts.begin() + nbvsi, it);
                // two faces winded in the same direction should have a crossed edge, where one face has p0->p1 and the other
                // has p1'->p0'. If the next point on the neighbouring face is also the next on the current face, we need
                // to reverse the neighbour
                nb_vidx = (nb_vidx + 1) % nbvc;
                size_t oursideidx = (a + 1) % vc;
                if( FuzzyVectorCompare(1e-6)(mVerts[vsi + oursideidx], mVerts[nbvsi + nb_vidx]) )
                {
                    std::reverse(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc);
                    std::reverse(neighbour.begin() + nbvsi, neighbour.begin() + nbvsi + nbvc);
                    for( size_t a = 0; a < nbvc - 1; ++a )
                        std::swap(neighbour[nbvsi + a], neighbour[nbvsi + a + 1]);
                }

                // either way we're done with the neighbour. Mark it as done and continue checking from there recursively
                faceDone[nbi] = true;
                todo.push_back(nbi);
            }
        }

        // no more faces reachable from this part of the surface, start over with a disjunct part and its farthest face
    }
}